

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compile_compute_shader_helper
               (NegativeTestContext *ctx,char **computeShaderSource,GLint *compileStatus)

{
  GLuint shader_00;
  GLuint shader;
  GLint *compileStatus_local;
  char **computeShaderSource_local;
  NegativeTestContext *ctx_local;
  
  shader_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
  *compileStatus = -1;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shader_00,1,computeShaderSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader_00,0x8b81,compileStatus);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader_00);
  return;
}

Assistant:

void compile_compute_shader_helper (NegativeTestContext& ctx, const char* const* computeShaderSource, GLint* compileStatus)
{
	GLuint shader = ctx.glCreateShader(GL_COMPUTE_SHADER);

	*compileStatus = -1;
	ctx.glShaderSource(shader, 1, computeShaderSource, DE_NULL);
	ctx.glCompileShader(shader);
	ctx.glGetShaderiv(shader, GL_COMPILE_STATUS, compileStatus);
	ctx.glDeleteShader(shader);
}